

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SlidingWindowsLayerParams::SerializeWithCachedSizes
          (SlidingWindowsLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SlidingWindowsLayerParams *this_local;
  
  iVar1 = axis(this);
  if (iVar1 != 0) {
    iVar1 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar1,output);
  }
  uVar2 = windowsize(this);
  if (uVar2 != 0) {
    uVar2 = windowsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar2,output);
  }
  uVar2 = step(this);
  if (uVar2 != 0) {
    uVar2 = step(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,uVar2,output);
  }
  return;
}

Assistant:

void SlidingWindowsLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SlidingWindowsLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // uint64 windowSize = 2;
  if (this->windowsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->windowsize(), output);
  }

  // uint64 step = 3;
  if (this->step() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->step(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SlidingWindowsLayerParams)
}